

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReader::preparse(QCborStreamReader *this)

{
  bool bVar1;
  byte bVar2;
  Code CVar3;
  CborType CVar4;
  pointer pQVar5;
  uint64_t uVar6;
  uint64_t *in_RDI;
  long in_FS_OFFSET;
  QIODevice *in_stack_00000030;
  qint64 in_stack_00000058;
  QByteArray *in_stack_ffffffffffffffc8;
  CborValue *in_stack_ffffffffffffffd0;
  Code local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (Code)lastError((QCborStreamReader *)in_stack_ffffffffffffffd0);
  CVar3 = QCborError::operator_cast_to_Code((QCborError *)&local_c);
  if (CVar3 == NoError) {
    pQVar5 = std::
             unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
             operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                         *)0x8d966f);
    CVar4 = cbor_value_get_type(&pQVar5->currentElement);
    *(char *)(in_RDI + 2) = (char)CVar4;
    if ((char)in_RDI[2] == -1) {
      pQVar5 = std::
               unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
               ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                             *)0x8d96a2);
      if (pQVar5->device != (QIODevice *)0x0) {
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d96ba);
        bVar1 = QList<CborValue>::isEmpty((QList<CborValue> *)0x8d96c6);
        if (bVar1) {
          std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
          ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                        *)0x8d96da);
          QByteArray::clear((QByteArray *)0x8d96e6);
          pQVar5 = std::
                   unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                   ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                                 *)0x8d96f4);
          if (pQVar5->bufferStart != 0) {
            std::
            unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
            operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                        *)0x8d9709);
            std::
            unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
            operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                        *)0x8d971f);
            QIODevice::skip(in_stack_00000030,in_stack_00000058);
          }
          pQVar5 = std::
                   unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                   ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                                 *)0x8d973b);
          pQVar5->bufferStart = 0;
        }
      }
    }
    else {
      pQVar5 = std::
               unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
               ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                             *)0x8d975e);
      (pQVar5->lastError).c = NoError;
      if ((((char)in_RDI[2] == -0xb) || ((char)in_RDI[2] == -10)) || ((char)in_RDI[2] == -9)) {
        *(undefined1 *)(in_RDI + 2) = 0xe0;
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d97aa);
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d97c1);
        bVar2 = QByteArray::at(in_stack_ffffffffffffffc8,0x8d97cf);
        *in_RDI = (long)(int)(bVar2 - 0xe0);
      }
      else {
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d97f5);
        uVar6 = _cbor_value_extract_int64_helper(in_stack_ffffffffffffffd0);
        *in_RDI = uVar6;
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d9812);
        bVar1 = cbor_value_is_negative_integer(in_stack_ffffffffffffffd0);
        if (bVar1) {
          *(undefined1 *)(in_RDI + 2) = 0x20;
        }
      }
    }
  }
  else {
    *(undefined1 *)(in_RDI + 2) = 0xff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QCborStreamReader::preparse()
{
    if (lastError() == QCborError::NoError) {
        type_ = cbor_value_get_type(&d->currentElement);

        if (type_ == CborInvalidType) {
            // We may have reached the end.
            if (d->device && d->containerStack.isEmpty()) {
                d->buffer.clear();
                if (d->bufferStart)
                    d->device->skip(d->bufferStart);
                d->bufferStart = 0;
            }
        } else {
            d->lastError = {};
            // Undo the type mapping that TinyCBOR does (we have an explicit type
            // for negative integer and we don't have separate types for Boolean,
            // Null and Undefined).
            if (type_ == CborBooleanType || type_ == CborNullType || type_ == CborUndefinedType) {
                type_ = CborSimpleType;
                value64 = quint8(d->buffer.at(d->bufferStart)) - CborSimpleType;
            } else {
                // Using internal TinyCBOR API!
                value64 = _cbor_value_extract_int64_helper(&d->currentElement);

                if (cbor_value_is_negative_integer(&d->currentElement))
                    type_ = quint8(QCborStreamReader::NegativeInteger);
            }
        }
    } else {
        type_ = Invalid;
    }
}